

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void av1_write_tx_type(AV1_COMMON *cm,MACROBLOCKD *xd,TX_TYPE tx_type,TX_SIZE tx_size,aom_writer *w)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  int s;
  MB_MODE_INFO *pMVar4;
  short sVar5;
  PREDICTION_MODE *pPVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  aom_cdf_prob *icdf;
  
  pMVar4 = *xd->mi;
  uVar8 = 1;
  if (-1 < (char)*(ushort *)&pMVar4->field_0xa7) {
    uVar8 = (ulong)('\0' < pMVar4->ref_frame[0]);
  }
  uVar9 = (ulong)tx_size;
  if ((0x61810UL >> (uVar9 & 0x3f) & 1) != 0) {
    return;
  }
  bVar1 = (cm->features).reduced_tx_set_used;
  iVar7 = (int)uVar8;
  bVar12 = (byte)uVar8;
  bVar11 = bVar12;
  if ((0x18608UL >> (uVar9 & 0x3f) & 1) == 0) {
    if (bVar1 != false) goto LAB_0019ab9c;
    bVar11 = av1_ext_tx_set_lookup[0]
             [(ulong)((0x60604UL >> (uVar9 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar7 * 2)];
  }
  if (bVar11 == 0) {
    return;
  }
LAB_0019ab9c:
  if ((cm->seg).enabled == '\0') {
    if ((cm->quant_params).base_qindex < 1) {
      return;
    }
    bVar11 = pMVar4->skip_txfm;
  }
  else {
    uVar10 = *(ushort *)&pMVar4->field_0xa7 & 7;
    if (xd->qindex[uVar10] < 1) {
      return;
    }
    if (pMVar4->skip_txfm != '\0') {
      return;
    }
    bVar11 = (byte)(cm->seg).feature_mask[uVar10] & 0x40;
  }
  if (bVar11 == 0) {
    bVar11 = ""[uVar9];
    uVar13 = uVar8;
    if ((0x18608UL >> (uVar9 & 0x3f) & 1) == 0) {
      if (bVar1 == false) {
        bVar12 = av1_ext_tx_set_lookup[0]
                 [(ulong)((0x60604UL >> (uVar9 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar7 * 2)];
      }
      else {
        bVar12 = (iVar7 == 0) + 1;
      }
      uVar13 = (ulong)bVar12;
    }
    if (iVar7 == 0) {
      if ((pMVar4->filter_intra_mode_info).use_filter_intra == '\0') {
        pPVar6 = &pMVar4->mode;
      }
      else {
        pPVar6 = "" + (pMVar4->filter_intra_mode_info).filter_intra_mode;
      }
      aom_write_symbol(w,*(int *)((long)av1_ext_tx_ind[0] +
                                 (ulong)tx_type * 4 + (ulong)(uint)((int)uVar13 << 6)),
                       xd->tile_ctx->intra_ext_tx_cdf[ext_tx_set_index[uVar8][bVar12]][bVar11][0] +
                       (ulong)*pPVar6 + (ulong)*pPVar6 * 0x10,av1_num_ext_tx_set[uVar13]);
      return;
    }
    iVar7 = av1_num_ext_tx_set[uVar13];
    s = *(int *)((long)av1_ext_tx_ind[0] + (ulong)tx_type * 4 + (ulong)(uint)((int)uVar13 << 6));
    icdf = xd->tile_ctx->inter_ext_tx_cdf[ext_tx_set_index[uVar8][bVar12]][0] +
           (ulong)bVar11 + (ulong)bVar11 * 0x10;
    od_ec_encode_cdf_q15(&w->ec,s,icdf,iVar7);
    if (w->allow_update_cdf != '\0') {
      uVar2 = icdf[iVar7];
      bVar12 = ((char)(uVar2 >> 4) - ((byte)uVar13 < 2)) + 5;
      uVar8 = 1;
      if (1 < (int)(iVar7 - 1U)) {
        uVar8 = (ulong)(iVar7 - 1U);
      }
      uVar9 = 0;
      do {
        uVar3 = icdf[uVar9];
        if ((long)uVar9 < (long)(char)s) {
          sVar5 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar12 & 0x1f));
        }
        else {
          sVar5 = -(uVar3 >> (bVar12 & 0x1f));
        }
        icdf[uVar9] = sVar5 + uVar3;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      icdf[iVar7] = icdf[iVar7] + (ushort)(uVar2 < 0x20);
    }
  }
  return;
}

Assistant:

void av1_write_tx_type(const AV1_COMMON *const cm, const MACROBLOCKD *xd,
                       TX_TYPE tx_type, TX_SIZE tx_size, aom_writer *w) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const FeatureFlags *const features = &cm->features;
  const int is_inter = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, is_inter, features->reduced_tx_set_used) > 1 &&
      ((!cm->seg.enabled && cm->quant_params.base_qindex > 0) ||
       (cm->seg.enabled && xd->qindex[mbmi->segment_id] > 0)) &&
      !mbmi->skip_txfm &&
      !segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];
    const TxSetType tx_set_type = av1_get_ext_tx_set_type(
        tx_size, is_inter, features->reduced_tx_set_used);
    const int eset =
        get_ext_tx_set(tx_size, is_inter, features->reduced_tx_set_used);
    // eset == 0 should correspond to a set with only DCT_DCT and there
    // is no need to send the tx_type
    assert(eset > 0);
    assert(av1_ext_tx_used[tx_set_type][tx_type]);
    if (is_inter) {
      aom_write_symbol(w, av1_ext_tx_ind[tx_set_type][tx_type],
                       ec_ctx->inter_ext_tx_cdf[eset][square_tx_size],
                       av1_num_ext_tx_set[tx_set_type]);
    } else {
      PREDICTION_MODE intra_dir;
      if (mbmi->filter_intra_mode_info.use_filter_intra)
        intra_dir =
            fimode_to_intradir[mbmi->filter_intra_mode_info.filter_intra_mode];
      else
        intra_dir = mbmi->mode;
      aom_write_symbol(
          w, av1_ext_tx_ind[tx_set_type][tx_type],
          ec_ctx->intra_ext_tx_cdf[eset][square_tx_size][intra_dir],
          av1_num_ext_tx_set[tx_set_type]);
    }
  }
}